

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O0

FT_Error af_property_set(FT_Module ft_module,char *property_name,void *value,FT_Bool value_is_string
                        )

{
  AF_Script AVar1;
  AF_Script AVar2;
  AF_Script AVar3;
  AF_Script AVar4;
  AF_Script AVar5;
  AF_Script AVar6;
  AF_Script AVar7;
  AF_Script AVar8;
  int iVar9;
  long lVar10;
  FT_Bool *no_stem_darkening;
  long nsd;
  char *s_1;
  char *pcStack_c8;
  int i;
  char *ep;
  char *s;
  FT_Int dp [8];
  FT_Int y4;
  FT_Int x4;
  FT_Int y3;
  FT_Int x3;
  FT_Int y2;
  FT_Int x2;
  FT_Int y1;
  FT_Int x1;
  FT_Int *darken_params;
  AF_FaceGlobals globals;
  FT_Prop_IncreaseXHeight *prop;
  AF_Script *default_script;
  AF_StyleClass style_class;
  FT_UInt ss;
  AF_Script *fallback_script;
  AF_Module module;
  FT_Error error;
  FT_Bool value_is_string_local;
  void *value_local;
  char *property_name_local;
  FT_Module ft_module_local;
  
  module._0_4_ = 0;
  fallback_script = (AF_Script *)ft_module;
  module._7_1_ = value_is_string;
  _error = (AF_FaceGlobals)value;
  value_local = property_name;
  property_name_local = (char *)ft_module;
  iVar9 = strcmp(property_name,"fallback-script");
  if (iVar9 == 0) {
    if (module._7_1_ == '\0') {
      for (style_class._4_4_ = AF_SCRIPT_ADLM;
          af_style_classes[style_class._4_4_] != (AF_StyleClass)0x0;
          style_class._4_4_ = style_class._4_4_ + AF_SCRIPT_ARAB) {
        if ((af_style_classes[style_class._4_4_]->script == *(AF_Script *)&_error->face) &&
           (af_style_classes[style_class._4_4_]->coverage == AF_COVERAGE_DEFAULT)) {
          fallback_script[6] = style_class._4_4_;
          break;
        }
      }
      if (af_style_classes[style_class._4_4_] == (AF_StyleClass)0x0) {
        ft_module_local._4_4_ = 6;
      }
      else {
        ft_module_local._4_4_ = (FT_Error)module;
      }
    }
    else {
      ft_module_local._4_4_ = 6;
    }
  }
  else {
    iVar9 = strcmp((char *)value_local,"default-script");
    if (iVar9 == 0) {
      if (module._7_1_ == '\0') {
        fallback_script[7] = *(AF_Script *)&_error->face;
        ft_module_local._4_4_ = (FT_Error)module;
      }
      else {
        ft_module_local._4_4_ = 6;
      }
    }
    else {
      iVar9 = strcmp((char *)value_local,"increase-x-height");
      if (iVar9 == 0) {
        if (module._7_1_ == '\0') {
          globals = _error;
          ft_module_local._4_4_ =
               af_property_get_face_globals
                         (_error->face,(AF_FaceGlobals *)&darken_params,(AF_Module)fallback_script);
          if (ft_module_local._4_4_ == 0) {
            darken_params[6] = globals->glyph_count;
          }
        }
        else {
          ft_module_local._4_4_ = 6;
        }
      }
      else {
        iVar9 = strcmp((char *)value_local,"darkening-parameters");
        if (iVar9 == 0) {
          if (module._7_1_ == '\0') {
            _y1 = _error;
          }
          else {
            ep = (char *)_error;
            for (s_1._4_4_ = 0; s_1._4_4_ < 7; s_1._4_4_ = s_1._4_4_ + 1) {
              lVar10 = strtol(ep,&stack0xffffffffffffff38,10);
              dp[(long)s_1._4_4_ + -2] = (FT_Int)lVar10;
              if ((*pcStack_c8 != ',') || (ep == pcStack_c8)) {
                return 6;
              }
              ep = pcStack_c8 + 1;
            }
            strtol(ep,&stack0xffffffffffffff38,10);
            if (((*pcStack_c8 != '\0') && (*pcStack_c8 != ' ')) || (ep == pcStack_c8)) {
              return 6;
            }
            _y1 = (AF_FaceGlobals)&s;
          }
          AVar1 = *(AF_Script *)&_y1->face;
          AVar2 = *(AF_Script *)((long)&_y1->face + 4);
          AVar3 = _y1->glyph_count;
          AVar4 = *(AF_Script *)&_y1->field_0xc;
          AVar5 = *(AF_Script *)&_y1->glyph_styles;
          AVar6 = *(AF_Script *)((long)&_y1->glyph_styles + 4);
          AVar7 = _y1->increase_x_height;
          AVar8 = *(AF_Script *)&_y1->field_0x1c;
          if (((((int)AVar1 < 0) || ((int)AVar3 < 0)) ||
              (((int)AVar5 < 0 || (((int)AVar7 < 0 || ((int)AVar2 < 0)))))) ||
             (((int)AVar4 < 0 ||
              (((((((int)AVar6 < 0 || ((int)AVar8 < 0)) || ((int)AVar3 < (int)AVar1)) ||
                 (((int)AVar5 < (int)AVar3 || ((int)AVar7 < (int)AVar5)))) ||
                ((500 < (int)AVar2 || ((500 < (int)AVar4 || (500 < (int)AVar6)))))) ||
               (500 < (int)AVar8)))))) {
            ft_module_local._4_4_ = 6;
          }
          else {
            fallback_script[9] = AVar1;
            fallback_script[10] = AVar2;
            fallback_script[0xb] = AVar3;
            fallback_script[0xc] = AVar4;
            fallback_script[0xd] = AVar5;
            fallback_script[0xe] = AVar6;
            fallback_script[0xf] = AVar7;
            fallback_script[0x10] = AVar8;
            ft_module_local._4_4_ = (FT_Error)module;
          }
        }
        else {
          iVar9 = strcmp((char *)value_local,"no-stem-darkening");
          if (iVar9 == 0) {
            if (module._7_1_ == '\0') {
              *(undefined1 *)(fallback_script + 8) = *(undefined1 *)&_error->face;
            }
            else {
              lVar10 = strtol((char *)_error,(char **)0x0,10);
              if (lVar10 == 0) {
                *(undefined1 *)(fallback_script + 8) = AF_SCRIPT_ADLM;
              }
              else {
                *(undefined1 *)(fallback_script + 8) = AF_SCRIPT_ARAB;
              }
            }
            ft_module_local._4_4_ = (FT_Error)module;
          }
          else {
            ft_module_local._4_4_ = 0xc;
          }
        }
      }
    }
  }
  return ft_module_local._4_4_;
}

Assistant:

static FT_Error
  af_property_set( FT_Module    ft_module,
                   const char*  property_name,
                   const void*  value,
                   FT_Bool      value_is_string )
  {
    FT_Error   error  = FT_Err_Ok;
    AF_Module  module = (AF_Module)ft_module;

#ifndef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
    FT_UNUSED( value_is_string );
#endif


    if ( !ft_strcmp( property_name, "fallback-script" ) )
    {
      AF_Script*  fallback_script;
      FT_UInt     ss;


#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
        return FT_THROW( Invalid_Argument );
#endif

      fallback_script = (AF_Script*)value;

      /* We translate the fallback script to a fallback style that uses */
      /* `fallback-script' as its script and `AF_COVERAGE_NONE' as its  */
      /* coverage value.                                                */
      for ( ss = 0; af_style_classes[ss]; ss++ )
      {
        AF_StyleClass  style_class = af_style_classes[ss];


        if ( style_class->script   == *fallback_script    &&
             style_class->coverage == AF_COVERAGE_DEFAULT )
        {
          module->fallback_style = ss;
          break;
        }
      }

      if ( !af_style_classes[ss] )
      {
        FT_TRACE2(( "af_property_set: Invalid value %d for property `%s'\n",
                    *fallback_script, property_name ));
        return FT_THROW( Invalid_Argument );
      }

      return error;
    }
    else if ( !ft_strcmp( property_name, "default-script" ) )
    {
      AF_Script*  default_script;


#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
        return FT_THROW( Invalid_Argument );
#endif

      default_script = (AF_Script*)value;

      module->default_script = *default_script;

      return error;
    }
    else if ( !ft_strcmp( property_name, "increase-x-height" ) )
    {
      FT_Prop_IncreaseXHeight*  prop;
      AF_FaceGlobals            globals;


#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
        return FT_THROW( Invalid_Argument );
#endif

      prop = (FT_Prop_IncreaseXHeight*)value;

      error = af_property_get_face_globals( prop->face, &globals, module );
      if ( !error )
        globals->increase_x_height = prop->limit;

      return error;
    }
    else if ( !ft_strcmp( property_name, "darkening-parameters" ) )
    {
      FT_Int*  darken_params;
      FT_Int   x1, y1, x2, y2, x3, y3, x4, y4;

#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      FT_Int   dp[8];


      if ( value_is_string )
      {
        const char*  s = (const char*)value;
        char*        ep;
        int          i;


        /* eight comma-separated numbers */
        for ( i = 0; i < 7; i++ )
        {
          dp[i] = (FT_Int)ft_strtol( s, &ep, 10 );
          if ( *ep != ',' || s == ep )
            return FT_THROW( Invalid_Argument );

          s = ep + 1;
        }

        dp[7] = (FT_Int)ft_strtol( s, &ep, 10 );
        if ( !( *ep == '\0' || *ep == ' ' ) || s == ep )
          return FT_THROW( Invalid_Argument );

        darken_params = dp;
      }
      else
#endif
        darken_params = (FT_Int*)value;

      x1 = darken_params[0];
      y1 = darken_params[1];
      x2 = darken_params[2];
      y2 = darken_params[3];
      x3 = darken_params[4];
      y3 = darken_params[5];
      x4 = darken_params[6];
      y4 = darken_params[7];

      if ( x1 < 0   || x2 < 0   || x3 < 0   || x4 < 0   ||
           y1 < 0   || y2 < 0   || y3 < 0   || y4 < 0   ||
           x1 > x2  || x2 > x3  || x3 > x4              ||
           y1 > 500 || y2 > 500 || y3 > 500 || y4 > 500 )
        return FT_THROW( Invalid_Argument );

      module->darken_params[0] = x1;
      module->darken_params[1] = y1;
      module->darken_params[2] = x2;
      module->darken_params[3] = y2;
      module->darken_params[4] = x3;
      module->darken_params[5] = y3;
      module->darken_params[6] = x4;
      module->darken_params[7] = y4;

      return error;
    }
    else if ( !ft_strcmp( property_name, "no-stem-darkening" ) )
    {
#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
      {
        const char*  s   = (const char*)value;
        long         nsd = ft_strtol( s, NULL, 10 );


        if ( !nsd )
          module->no_stem_darkening = FALSE;
        else
          module->no_stem_darkening = TRUE;
      }
      else
#endif
      {
        FT_Bool*  no_stem_darkening = (FT_Bool*)value;


        module->no_stem_darkening = *no_stem_darkening;
      }

      return error;
    }

    FT_TRACE2(( "af_property_set: missing property `%s'\n",
                property_name ));
    return FT_THROW( Missing_Property );
  }